

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t *
Gia_ManMiter(Gia_Man_t *p0,Gia_Man_t *p1,int nInsDup,int fDualOut,int fSeq,int fImplic,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p;
  int iVar7;
  char *pcVar8;
  
  iVar7 = p0->vCis->nSize;
  if (fSeq == 0) {
    if (iVar7 == p1->vCis->nSize) {
      if (p0->vCos->nSize == p1->vCos->nSize) {
LAB_001db79f:
        pGVar4 = Gia_ManStart(p1->nObjs + p0->nObjs);
        pcVar8 = Abc_UtilStrsav("miter");
        pGVar4->pName = pcVar8;
        Gia_ManFillValue(p0);
        Gia_ManFillValue(p1);
        p0->pObjs->Value = 0;
        p1->pObjs->Value = 0;
        Gia_ManHashAlloc(pGVar4);
        if (fSeq == 0) {
          iVar7 = 0;
          while ((iVar7 < p0->vCis->nSize &&
                 (pGVar5 = Gia_ManCi(p0,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            uVar1 = Gia_ManAppendCi(pGVar4);
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p1->vCis->nSize &&
                 (pGVar5 = Gia_ManCi(p1,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            if (iVar7 < p1->vCis->nSize - nInsDup) {
              pGVar6 = Gia_ManCi(pGVar4,iVar7);
              uVar1 = Gia_ObjToLit(pGVar4,pGVar6);
            }
            else {
              uVar1 = Gia_ManAppendCi(pGVar4);
            }
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p0->vCos->nSize &&
                 (pGVar5 = Gia_ManCo(p0,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            Gia_ManMiter_rec(pGVar4,p0,pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff));
            pGVar6 = Gia_ManCo(p1,iVar7);
            Gia_ManMiter_rec(pGVar4,p1,pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff));
            iVar2 = Gia_ObjFanin0Copy(pGVar5);
            if (fDualOut == 0) {
              if (fImplic == 0) {
                pGVar5 = Gia_ManCo(p1,iVar7);
                iVar3 = Gia_ObjFanin0Copy(pGVar5);
                iVar2 = Gia_ManHashXor(pGVar4,iVar2,iVar3);
              }
              else {
                pGVar5 = Gia_ManPo(p1,iVar7);
                iVar3 = Gia_ObjFanin0Copy(pGVar5);
                iVar3 = Abc_LitNot(iVar3);
                iVar2 = Gia_ManHashAnd(pGVar4,iVar2,iVar3);
              }
            }
            else {
              Gia_ManAppendCo(pGVar4,iVar2);
              pGVar5 = Gia_ManCo(p1,iVar7);
              iVar2 = Gia_ObjFanin0Copy(pGVar5);
            }
            Gia_ManAppendCo(pGVar4,iVar2);
            iVar7 = iVar7 + 1;
          }
        }
        else {
          iVar7 = 0;
          while ((iVar7 < p0->vCis->nSize - p0->nRegs &&
                 (pGVar5 = Gia_ManCi(p0,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            uVar1 = Gia_ManAppendCi(pGVar4);
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p1->vCis->nSize - p1->nRegs &&
                 (pGVar5 = Gia_ManCi(p1,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            if (iVar7 < p1->vCis->nSize - (p1->nRegs + nInsDup)) {
              pGVar6 = Gia_ManPi(pGVar4,iVar7);
              uVar1 = Gia_ObjToLit(pGVar4,pGVar6);
            }
            else {
              uVar1 = Gia_ManAppendCi(pGVar4);
            }
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p0->nRegs &&
                 (pGVar5 = Gia_ManCi(p0,(p0->vCis->nSize - p0->nRegs) + iVar7),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
            uVar1 = Gia_ManAppendCi(pGVar4);
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p1->nRegs &&
                 (pGVar5 = Gia_ManCi(p1,(p1->vCis->nSize - p1->nRegs) + iVar7),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
            uVar1 = Gia_ManAppendCi(pGVar4);
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p0->vCos->nSize - p0->nRegs &&
                 (pGVar5 = Gia_ManCo(p0,iVar7), pGVar5 != (Gia_Obj_t *)0x0))) {
            Gia_ManMiter_rec(pGVar4,p0,pGVar5 + -(*(ulong *)pGVar5 & 0x1fffffff));
            pGVar6 = Gia_ManPo(p1,iVar7);
            Gia_ManMiter_rec(pGVar4,p1,pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff));
            iVar2 = Gia_ObjFanin0Copy(pGVar5);
            if (fDualOut == 0) {
              pGVar5 = Gia_ManPo(p1,iVar7);
              iVar3 = Gia_ObjFanin0Copy(pGVar5);
              if (fImplic == 0) {
                iVar2 = Gia_ManHashXor(pGVar4,iVar2,iVar3);
              }
              else {
                iVar3 = Abc_LitNot(iVar3);
                iVar2 = Gia_ManHashAnd(pGVar4,iVar2,iVar3);
              }
            }
            else {
              Gia_ManAppendCo(pGVar4,iVar2);
              pGVar5 = Gia_ManPo(p1,iVar7);
              iVar2 = Gia_ObjFanin0Copy(pGVar5);
            }
            Gia_ManAppendCo(pGVar4,iVar2);
            iVar7 = iVar7 + 1;
          }
          iVar7 = 0;
          while ((iVar7 < p0->nRegs &&
                 (pGVar5 = Gia_ManCo(p0,(p0->vCos->nSize - p0->nRegs) + iVar7),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
            Gia_ManMiter_rec(pGVar4,p0,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
            iVar2 = Gia_ObjFanin0Copy(pGVar5);
            uVar1 = Gia_ManAppendCo(pGVar4,iVar2);
            pGVar5->Value = uVar1;
            iVar7 = iVar7 + 1;
          }
          for (iVar7 = 0; iVar2 = p1->nRegs, iVar7 < iVar2; iVar7 = iVar7 + 1) {
            pGVar5 = Gia_ManCo(p1,(p1->vCos->nSize - iVar2) + iVar7);
            if (pGVar5 == (Gia_Obj_t *)0x0) {
              iVar2 = p1->nRegs;
              break;
            }
            Gia_ManMiter_rec(pGVar4,p1,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
            iVar2 = Gia_ObjFanin0Copy(pGVar5);
            uVar1 = Gia_ManAppendCo(pGVar4,iVar2);
            pGVar5->Value = uVar1;
          }
          Gia_ManSetRegNum(pGVar4,iVar2 + p0->nRegs);
        }
        Gia_ManHashStop(pGVar4);
        p = Gia_ManCleanup(pGVar4);
        Gia_ManStop(pGVar4);
        pGVar4 = Gia_ManDupNormalize(p,0);
        Gia_ManStop(p);
        return pGVar4;
      }
      pcVar8 = "Gia_ManMiter(): Designs have different number of COs.";
    }
    else {
      pcVar8 = "Gia_ManMiter(): Designs have different number of CIs.";
    }
  }
  else {
    iVar2 = p0->nRegs;
    iVar3 = p1->nRegs;
    if (iVar7 - iVar2 == p1->vCis->nSize - iVar3) {
      if (p0->vCos->nSize - iVar2 == p1->vCos->nSize - iVar3) {
        if (iVar2 != 0 && iVar3 != 0) goto LAB_001db79f;
        pcVar8 = "Gia_ManMiter(): At least one of the designs has no registers.";
      }
      else {
        pcVar8 = "Gia_ManMiter(): Designs have different number of POs.";
      }
    }
    else {
      pcVar8 = "Gia_ManMiter(): Designs have different number of PIs.";
    }
  }
  puts(pcVar8);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManMiter( Gia_Man_t * p0, Gia_Man_t * p1, int nInsDup, int fDualOut, int fSeq, int fImplic, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLit;
    if ( fSeq )
    {
        if ( Gia_ManPiNum(p0) != Gia_ManPiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of PIs.\n" );
            return NULL;
        }
        if ( Gia_ManPoNum(p0) != Gia_ManPoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of POs.\n" );
            return NULL;
        }
        if ( Gia_ManRegNum(p0) == 0 || Gia_ManRegNum(p1) == 0 )
        {
            printf( "Gia_ManMiter(): At least one of the designs has no registers.\n" );
            return NULL;
        }
    }
    else
    {
        if ( Gia_ManCiNum(p0) != Gia_ManCiNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of CIs.\n" );
            return NULL;
        }
        if ( Gia_ManCoNum(p0) != Gia_ManCoNum(p1) )
        {
            printf( "Gia_ManMiter(): Designs have different number of COs.\n" );
            return NULL;
        }
    }
    // start the manager
    pNew = Gia_ManStart( Gia_ManObjNum(p0) + Gia_ManObjNum(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    // map combinational inputs
    Gia_ManFillValue( p0 );
    Gia_ManFillValue( p1 );
    Gia_ManConst0(p0)->Value = 0;
    Gia_ManConst0(p1)->Value = 0;
    // map internal nodes and outputs
    Gia_ManHashAlloc( pNew );
    if ( fSeq )
    {
        // create primary inputs
        Gia_ManForEachPi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPi( p1, pObj, i )
            if ( i < Gia_ManPiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManPi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create latch outputs
        Gia_ManForEachRo( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p1, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        // create primary outputs
        Gia_ManForEachPo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManPo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else 
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManPo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
        // create register inputs
        Gia_ManForEachRi( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManForEachRi( p1, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(pObj) );
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p0) + Gia_ManRegNum(p1) );
    }
    else
    {
        // create combinational inputs
        Gia_ManForEachCi( p0, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachCi( p1, pObj, i )
            if ( i < Gia_ManCiNum(p1) - nInsDup )
                pObj->Value = Gia_ObjToLit( pNew, Gia_ManCi(pNew, i) );
            else
                pObj->Value = Gia_ManAppendCi( pNew );
        // create combinational outputs
        Gia_ManForEachCo( p0, pObj, i )
        {
            Gia_ManMiter_rec( pNew, p0, Gia_ObjFanin0(pObj) );
            Gia_ManMiter_rec( pNew, p1, Gia_ObjFanin0(Gia_ManCo(p1,i)) );
            if ( fDualOut )
            {
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
            }
            else if ( fImplic )
            {
                iLit = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Abc_LitNot(Gia_ObjFanin0Copy(Gia_ManPo(p1,i))) );
                Gia_ManAppendCo( pNew, iLit );
            }
            else
            {
                iLit = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin0Copy(Gia_ManCo(p1,i)) );
                Gia_ManAppendCo( pNew, iLit );
            }
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    pNew = Gia_ManDupNormalize( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}